

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int checkRef(IntegrityCk *pCheck,Pgno iPage)

{
  byte bVar1;
  int iVar2;
  
  if (iPage - 1 < pCheck->nCkPage) {
    iVar2 = 1;
    bVar1 = pCheck->aPgRef[iPage >> 3];
    if ((bVar1 >> (iPage & 7) & 1) == 0) {
      pCheck->aPgRef[iPage >> 3] = (byte)(1 << ((byte)iPage & 7)) | bVar1;
      iVar2 = 0;
    }
    else {
      checkAppendMsg(pCheck,"2nd reference to page %u");
    }
  }
  else {
    checkAppendMsg(pCheck,"invalid page number %u");
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int checkRef(IntegrityCk *pCheck, Pgno iPage){
  if( iPage>pCheck->nCkPage || iPage==0 ){
    checkAppendMsg(pCheck, "invalid page number %u", iPage);
    return 1;
  }
  if( getPageReferenced(pCheck, iPage) ){
    checkAppendMsg(pCheck, "2nd reference to page %u", iPage);
    return 1;
  }
  setPageReferenced(pCheck, iPage);
  return 0;
}